

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O3

Ref<embree::XML> __thiscall
embree::parseHeader(embree *this,Ref<embree::Stream<embree::Token>_> *cin)

{
  pointer pcVar1;
  bool bVar2;
  XML *this_00;
  Token *pTVar3;
  runtime_error *this_01;
  long *plVar4;
  size_type *psVar5;
  Ref<embree::XML> *xml;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  string local_b8;
  string local_98;
  Token local_78;
  
  this_00 = (XML *)operator_new(0xb0);
  pcVar1 = local_100 + 0x10;
  local_100._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
  XML::XML(this_00,(string *)local_100);
  *(XML **)this = this_00;
  (*(this_00->super_RefCount)._vptr_RefCount[2])(this_00);
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_);
  }
  Stream<embree::Token>::get((Token *)local_100,cin->ptr);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"<?","");
  Token::Sym(&local_78,&local_98);
  bVar2 = operator==((Token *)local_100,&local_78);
  if (local_78.loc.fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.loc.fileName.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.str._M_dataplus._M_p != (pointer)((long)&local_78 + 0x18U)) {
    operator_delete(local_78.str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._8_8_ != &aStack_e8) {
    operator_delete((void *)local_100._8_8_);
  }
  if (bVar2) {
    Stream<embree::Token>::get((Token *)local_100,cin->ptr);
    Token::Identifier_abi_cxx11_((string *)&local_78,(Token *)local_100);
    std::__cxx11::string::operator=((string *)&this_00->name,(string *)&local_78);
    if ((pointer)local_78._0_8_ != (pointer)((long)&local_78 + 0x10U)) {
      operator_delete((void *)local_78._0_8_);
    }
    if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._8_8_ != &aStack_e8) {
      operator_delete((void *)local_100._8_8_);
    }
    parseComments(cin);
    while( true ) {
      pTVar3 = Stream<embree::Token>::peek(cin->ptr);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"?>","");
      Token::Sym((Token *)local_100,&local_b8);
      bVar2 = operator==(pTVar3,(Token *)local_100);
      if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._8_8_ != &aStack_e8) {
        operator_delete((void *)local_100._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (bVar2) break;
      parseParm(cin,&this_00->parms);
      parseComments(cin);
    }
    Stream<embree::Token>::drop(cin->ptr);
    return (Ref<embree::XML>)(XML *)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  pTVar3 = Stream<embree::Token>::unget(cin->ptr,1);
  ParseLocation::str_abi_cxx11_((string *)&local_78,&pTVar3->loc);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_100._0_8_ = *plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_100._0_8_ == psVar5) {
    local_100._16_8_ = *psVar5;
    aStack_e8._M_allocated_capacity = plVar4[3];
    local_100._0_8_ = pcVar1;
  }
  else {
    local_100._16_8_ = *psVar5;
  }
  local_100._8_8_ = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)local_100);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<XML> parseHeader(Ref<Stream<Token> >& cin)
  {
    Ref<XML> xml = new XML;
    if (cin->get() != Token::Sym("<?")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": wrong XML header");
    xml->name = cin->get().Identifier();
    parseComments(cin);
    while (cin->peek() != Token::Sym("?>")) {
      parseParm(cin,xml->parms);
      parseComments(cin);
    }
    cin->drop();
    return xml;
  }